

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

local_datetime_type * __thiscall
toml::basic_value<toml::type_config>::as_local_datetime(basic_value<toml::type_config> *this)

{
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ == local_datetime) {
    return (local_datetime_type *)&this->field_1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"toml::value::as_local_datetime()",&local_31);
  throw_bad_cast(this,&local_30,local_datetime);
}

Assistant:

local_datetime_type const& as_local_datetime() const
    {
        if(this->type_ != value_t::local_datetime)
        {
            this->throw_bad_cast("toml::value::as_local_datetime()", value_t::local_datetime);
        }
        return this->local_datetime_.value;
    }